

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_Decoder_AddMessageSetItem
               (upb_Decoder *d,upb_Message *msg,upb_MiniTable *t,uint32_t type_id,char *data,
               uint32_t size)

{
  bool bVar1;
  ulong size_00;
  _Bool _Var2;
  upb_DecodeStatus status;
  upb_MiniTableExtension *e;
  upb_Extension *puVar3;
  upb_Message *msg_00;
  size_t sVar4;
  size_t sVar5;
  upb_MiniTable *mt;
  uint uVar6;
  byte bVar8;
  char buf [30];
  byte abStack_89 [33];
  upb_StringView local_68;
  char *local_58;
  ulong local_50;
  byte *local_48;
  undefined8 local_40;
  ulong uVar7;
  
  size_00 = (ulong)size;
  e = upb_ExtensionRegistry_Lookup(d->extreg,t,type_id);
  if (e == (upb_MiniTableExtension *)0x0) {
    abStack_89[1] = 0xb;
    abStack_89[2] = 0x10;
    sVar5 = 3;
    do {
      sVar4 = sVar5;
      abStack_89[sVar4] = (0x7f < type_id) << 7 | (byte)type_id & 0x7f;
      bVar1 = 0x7f < type_id;
      sVar5 = sVar4 + 1;
      type_id = type_id >> 7;
    } while (bVar1);
    abStack_89[sVar4 + 1] = 0x1a;
    local_68.size = sVar4 + 1;
    uVar7 = size_00;
    do {
      sVar5 = local_68.size;
      uVar6 = (uint)uVar7;
      bVar8 = (byte)uVar7;
      uVar7 = uVar7 >> 7;
      abStack_89[sVar5 + 1] = (0x7f < uVar6) << 7 | bVar8 & 0x7f;
      local_68.size = sVar5 + 1;
    } while (0x7f < uVar6);
    abStack_89[sVar5 + 2] = 0xc;
    local_68.data = (char *)(abStack_89 + 1);
    local_40 = 1;
    local_58 = data;
    local_50 = size_00;
    local_48 = abStack_89 + sVar5 + 2;
    _Var2 = _upb_Message_AddUnknownV_dont_copy_me__upb_internal_use_only
                      (msg,&(d->field_7).arena,&local_68,3);
    if (!_Var2) goto LAB_00293e92;
  }
  else {
    puVar3 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                       (msg,e,&(d->field_7).arena);
    if (puVar3 == (upb_Extension *)0x0) {
LAB_00293e92:
      _upb_Decoder_ErrorJmp(d,kUpb_DecodeStatus_OutOfMemory);
    }
    msg_00 = _upb_Decoder_NewSubMessage2
                       (d,(puVar3->ext->sub_dont_copy_me__upb_internal_use_only).
                          submsg_dont_copy_me__upb_internal_use_only,
                        &puVar3->ext->field_dont_copy_me__upb_internal_use_only,
                        (upb_TaggedMessagePtr *)&(puVar3->data).uint32_val);
    bVar8 = (e->field_dont_copy_me__upb_internal_use_only).
            descriptortype_dont_copy_me__upb_internal_use_only;
    if (((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
        0x10) == 0) {
      if ((ulong)(bVar8 - 1) - 9 < 2) {
        mt = (e->sub_dont_copy_me__upb_internal_use_only).submsg_dont_copy_me__upb_internal_use_only
        ;
      }
      else {
        mt = (upb_MiniTable *)0x0;
      }
    }
    else {
      mt = (upb_MiniTable *)0x0;
      if ((bVar8 != 5) && (mt = (upb_MiniTable *)0x0, bVar8 != 0xc)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
    }
    status = upb_Decode(data,size_00,msg_00,mt,d->extreg,(uint)d->options,&(d->field_7).arena);
    if (status != kUpb_DecodeStatus_Ok) {
      _upb_Decoder_ErrorJmp(d,status);
    }
  }
  return;
}

Assistant:

static void upb_Decoder_AddMessageSetItem(upb_Decoder* d, upb_Message* msg,
                                          const upb_MiniTable* t,
                                          uint32_t type_id, const char* data,
                                          uint32_t size) {
  const upb_MiniTableExtension* item_mt =
      upb_ExtensionRegistry_Lookup(d->extreg, t, type_id);
  if (item_mt) {
    upb_Decoder_AddKnownMessageSetItem(d, msg, item_mt, data, size);
  } else {
    upb_Decoder_AddUnknownMessageSetItem(d, msg, type_id, data, size);
  }
}